

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

int quote_fname_ufs(char *file)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  char fbuf [256];
  
  pcVar2 = fbuf;
  pcVar3 = file;
  do {
    cVar1 = *pcVar3;
    if (((cVar1 == '\'') || (cVar1 == ';')) || (cVar1 == '>')) {
      pcVar4 = pcVar2 + 1;
      *pcVar2 = '\'';
      lVar5 = 2;
    }
    else {
      pcVar4 = pcVar2;
      lVar5 = 1;
      if (cVar1 == '\0') {
        *pcVar2 = '\0';
        bVar6 = false;
        pcVar3 = fbuf;
        while ((cVar1 = *pcVar3, cVar1 != '\0' && (!bVar6))) {
          pcVar2 = pcVar3 + 1;
          if (cVar1 == '\'') {
            if (pcVar3[1] != '\0') {
              pcVar2 = pcVar3 + 2;
            }
            pcVar3 = pcVar2;
            bVar6 = false;
          }
          else {
            bVar6 = false;
            pcVar3 = pcVar2;
            if (cVar1 == '.') {
              bVar6 = *pcVar2 != '\0';
            }
          }
        }
        if (!bVar6) {
          if (pcVar3[-1] == '.') {
            pcVar3[-1] = '\'';
            pcVar3[0] = '.';
            pcVar3 = pcVar3 + 1;
          }
          pcVar3[0] = '.';
          pcVar3[1] = '\0';
        }
        strcpy(file,fbuf);
        return 1;
      }
    }
    pcVar2 = pcVar2 + lVar5;
    *pcVar4 = cVar1;
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

int quote_fname_ufs(char *file)
{
  char *cp, *dp;
  int extensionp;
  char fbuf[MAXNAMLEN + 1];

  cp = file;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file
   * name or not.  If extension field is not included, we have to add a
   * period to specify empty extension field.
   */
  cp = fbuf;
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.':
        if (*(cp + 1)) extensionp = 1;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    if (*(cp - 1) == '.') {
      *(cp - 1) = '\'';
      *cp++ = '.';
    }
    *cp++ = '.';
    *cp = '\0';
  }
  strcpy(file, fbuf);
  return (1);
}